

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O2

void ares_process_fd(ares_channel_t *channel,ares_socket_t read_fd,ares_socket_t write_fd)

{
  size_t nevents;
  ares_socket_t aStack_20;
  undefined1 auStack_1c [4];
  ares_fd_events_t events [2];
  
  events[0].fd = 0;
  events[0].events = 0;
  events[1].fd = 0;
  events[1].events = 0;
  if (read_fd != -1) {
    events[0].events = 1;
    events[0].fd = read_fd;
  }
  nevents = (size_t)(read_fd != -1);
  if (write_fd != -1) {
    nevents = nevents + (write_fd != read_fd);
    events[nevents - 1].fd = write_fd;
    *(byte *)&events[nevents - 1].events = (byte)events[nevents - 1].events | 2;
  }
  ares_process_fds(channel,events,nevents,0);
  return;
}

Assistant:

void ares_process_fd(ares_channel_t *channel, ares_socket_t read_fd,
                     ares_socket_t write_fd)
{
  ares_fd_events_t events[2];
  size_t           nevents = 0;

  memset(events, 0, sizeof(events));

  if (read_fd != ARES_SOCKET_BAD) {
    nevents++;
    events[nevents - 1].fd      = read_fd;
    events[nevents - 1].events |= ARES_FD_EVENT_READ;
  }

  if (write_fd != ARES_SOCKET_BAD) {
    if (write_fd != read_fd) {
      nevents++;
    }
    events[nevents - 1].fd      = write_fd;
    events[nevents - 1].events |= ARES_FD_EVENT_WRITE;
  }

  ares_process_fds(channel, events, nevents, ARES_PROCESS_FLAG_NONE);
}